

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O1

ConstantValue * __thiscall
slang::ast::ConversionExpression::convert
          (ConstantValue *__return_storage_ptr__,ConversionExpression *this,EvalContext *context,
          Type *from,Type *to,SourceRange sourceRange,ConstantValue *value,
          ConversionKind conversionKind)

{
  SVQueue *pSVar1;
  Type *this_00;
  bool bVar2;
  bool bVar3;
  bitwidth_t bVar4;
  int iVar5;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar6;
  ConstantRange CVar7;
  variant_alternative_t<8UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar8;
  Type *this_01;
  variant_alternative_t<5UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *pvVar9;
  Diagnostic *pDVar10;
  logic_error *plVar11;
  long *plVar12;
  int iVar13;
  size_type *psVar14;
  long *plVar15;
  SourceRange sourceRange_00;
  SourceRange range;
  SVQueue result;
  undefined4 in_stack_fffffffffffffe7c;
  undefined1 in_stack_fffffffffffffe80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  long *local_150;
  long local_148;
  long local_140;
  long lStack_138;
  _Map_pointer local_130;
  undefined1 *local_128 [2];
  undefined1 local_118 [16];
  SVQueue local_108;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  _Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*> local_70;
  _Deque_iterator<slang::ConstantValue,_slang::ConstantValue_&,_slang::ConstantValue_*> local_50;
  
  if (*(char *)((long)sourceRange.startLoc + 0x20) == '\0') {
LAB_00390581:
    *(__index_type *)
     ((long)&(__return_storage_ptr__->value).
             super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
             .
             super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
     + 0x20) = '\0';
    return __return_storage_ptr__;
  }
  bVar2 = Type::isMatching((Type *)context,from);
  if (!bVar2) {
    if ((sourceRange.endLoc._0_4_ == 4) || (sourceRange.endLoc._0_4_ == 2)) {
      sourceRange_00.endLoc = (SourceLocation)this;
      sourceRange_00.startLoc = (SourceLocation)value;
      Bitstream::evaluateCast
                (__return_storage_ptr__,(Bitstream *)from,(Type *)sourceRange.startLoc,
                 (ConstantValue *)to,sourceRange_00,
                 (EvalContext *)
                 CONCAT44(in_stack_fffffffffffffe7c,(uint)(sourceRange.endLoc._0_4_ == 2)),
                 (bool)in_stack_fffffffffffffe80);
      return __return_storage_ptr__;
    }
    bVar2 = Type::isIntegral(from);
    if (bVar2) {
      if ((sourceRange.endLoc._0_4_ == 1) &&
         (*(char *)((long)sourceRange.startLoc + 0x20) == '\x01')) {
        pvVar6 = std::
                 get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                           ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             *)sourceRange.startLoc);
        bVar2 = Type::isSigned(from);
        (pvVar6->super_SVIntStorage).signFlag = bVar2;
      }
      bVar4 = Type::getBitWidth(from);
      bVar2 = Type::isSigned(from);
      bVar3 = Type::isFourState(from);
      ConstantValue::convertToInt
                (__return_storage_ptr__,(ConstantValue *)sourceRange.startLoc,bVar4,bVar2,bVar3);
      return __return_storage_ptr__;
    }
    if (from->canonical == (Type *)0x0) {
      Type::resolveCanonical(from);
    }
    if ((from->canonical->super_Symbol).kind == FloatingType) {
      bVar4 = Type::getBitWidth(from);
      if (bVar4 == 0x40) {
        ConstantValue::convertToReal(__return_storage_ptr__,(ConstantValue *)sourceRange.startLoc);
        return __return_storage_ptr__;
      }
      if (bVar4 == 0x20) {
        ConstantValue::convertToShortReal
                  (__return_storage_ptr__,(ConstantValue *)sourceRange.startLoc);
        return __return_storage_ptr__;
      }
      plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
      local_128[0] = local_118;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_128,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/AssignmentExpressions.cpp"
                 ,"");
      plVar12 = (long *)std::__cxx11::string::append((char *)local_128);
      local_170._M_dataplus._M_p = (pointer)*plVar12;
      psVar14 = (size_type *)(plVar12 + 2);
      if ((size_type *)local_170._M_dataplus._M_p == psVar14) {
        local_170.field_2._M_allocated_capacity = *psVar14;
        local_170.field_2._8_8_ = plVar12[3];
        local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      }
      else {
        local_170.field_2._M_allocated_capacity = *psVar14;
      }
      local_170._M_string_length = plVar12[1];
      *plVar12 = (long)psVar14;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      std::__cxx11::to_string(&local_b0,0x305);
      std::operator+(&local_90,&local_170,&local_b0);
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_90);
      local_150 = (long *)*plVar12;
      plVar15 = plVar12 + 2;
      if (local_150 == plVar15) {
        local_140 = *plVar15;
        lStack_138 = plVar12[3];
        local_150 = &local_140;
      }
      else {
        local_140 = *plVar15;
      }
      local_148 = plVar12[1];
      *plVar12 = (long)plVar15;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      plVar12 = (long *)std::__cxx11::string::append((char *)&local_150);
      local_108.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
      super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
      super__Deque_impl_data._M_map = (_Map_pointer)*plVar12;
      plVar15 = plVar12 + 2;
      if (local_108.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
          super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
          super__Deque_impl_data._M_map == (_Map_pointer)plVar15) {
        local_108.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
        super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)*plVar15;
        local_108.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
        super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
        super__Deque_impl_data._M_start._M_first = (_Elt_pointer)plVar12[3];
        local_108.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
        super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
        super__Deque_impl_data._M_map =
             &local_108.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
              super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl
              .super__Deque_impl_data._M_start._M_cur;
      }
      else {
        local_108.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
        super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)*plVar15;
      }
      local_108.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
      super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
      super__Deque_impl_data._M_map_size = plVar12[1];
      *plVar12 = (long)plVar15;
      plVar12[1] = 0;
      *(undefined1 *)(plVar12 + 2) = 0;
      std::logic_error::logic_error(plVar11,(string *)&local_108);
      __cxa_throw(plVar11,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    if ((from->canonical->super_Symbol).kind == StringType) {
      ConstantValue::convertToStr(__return_storage_ptr__,(ConstantValue *)sourceRange.startLoc);
      return __return_storage_ptr__;
    }
    bVar2 = Type::isUnpackedArray(from);
    if ((bVar2) && (bVar2 = Type::isUnpackedArray((Type *)context), bVar2)) {
      bVar2 = Type::hasFixedRange(from);
      if ((bVar2) && (bVar2 = Type::hasFixedRange((Type *)context), bVar2)) {
        assert::assertFailed
                  ("!to.hasFixedRange() || !from.hasFixedRange()",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/AssignmentExpressions.cpp"
                   ,0x30f,
                   "static ConstantValue slang::ast::ConversionExpression::convert(EvalContext &, const Type &, const Type &, SourceRange, ConstantValue &&, ConversionKind)"
                  );
      }
      bVar2 = Type::hasFixedRange(from);
      if (bVar2) {
        local_130 = (_Map_pointer)ConstantValue::size((ConstantValue *)sourceRange.startLoc);
        CVar7 = Type::getFixedRange(from);
        iVar5 = CVar7.left - CVar7.right;
        iVar13 = -iVar5;
        if (0 < iVar5) {
          iVar13 = iVar5;
        }
        if (local_130 != (_Map_pointer)(ulong)(iVar13 + 1)) {
          range.endLoc = (SourceLocation)value;
          range.startLoc = (SourceLocation)to;
          pDVar10 = EvalContext::addDiag((EvalContext *)this,(DiagCode)0x9000c,range);
          pDVar10 = ast::operator<<(pDVar10,(Type *)context);
          local_108.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
          super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
          super__Deque_impl_data._M_map = local_130;
          std::
          vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
          ::emplace_back<unsigned_long>(&pDVar10->args,(unsigned_long *)&local_108);
          ast::operator<<(pDVar10,from);
          goto LAB_00390581;
        }
      }
      if (from->canonical == (Type *)0x0) {
        Type::resolveCanonical(from);
      }
      if ((from->canonical->super_Symbol).kind != QueueType) {
        if (*(long *)((context->stack).super_SmallVectorBase<slang::ast::EvalContext::Frame>.
                      firstElement + 8) == 0) {
          Type::resolveCanonical((Type *)context);
        }
        if (**(int **)((context->stack).super_SmallVectorBase<slang::ast::EvalContext::Frame>.
                       firstElement + 8) == 0xf) {
          pvVar8 = std::
                   get<8ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                             ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               *)sourceRange.startLoc);
          pSVar1 = pvVar8->ptr;
          local_50._M_cur =
               (pSVar1->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
               super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
               _M_impl.super__Deque_impl_data._M_start._M_cur;
          local_50._M_first =
               (pSVar1->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
               super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
               _M_impl.super__Deque_impl_data._M_start._M_first;
          local_50._M_last =
               (pSVar1->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
               super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
               _M_impl.super__Deque_impl_data._M_start._M_last;
          local_50._M_node =
               (pSVar1->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
               super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
               _M_impl.super__Deque_impl_data._M_start._M_node;
          local_70._M_cur =
               (pSVar1->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
               super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
          local_70._M_first =
               (pSVar1->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
               super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_first;
          local_70._M_last =
               (pSVar1->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
               super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_last;
          local_70._M_node =
               (pSVar1->super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>).
               super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_node;
          std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>::
          vector<std::_Deque_iterator<slang::ConstantValue,slang::ConstantValue&,slang::ConstantValue*>,void>
                    ((vector<slang::ConstantValue,std::allocator<slang::ConstantValue>> *)&local_108
                     ,&local_50,&local_70,(allocator_type *)&local_150);
          *(_Map_pointer *)
           &(__return_storage_ptr__->value).
            super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            .
            super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
               = local_108.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                 super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                 _M_impl.super__Deque_impl_data._M_map;
          *(size_t *)
           ((long)&(__return_storage_ptr__->value).
                   super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           + 8) = local_108.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                  .super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                  _M_impl.super__Deque_impl_data._M_map_size;
          *(_Elt_pointer *)
           ((long)&(__return_storage_ptr__->value).
                   super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           + 0x10) = local_108.
                     super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                     super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                     _M_impl.super__Deque_impl_data._M_start._M_cur;
          local_108.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
          super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
          super__Deque_impl_data._M_map = (_Map_pointer)0x0;
          local_108.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
          super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
          super__Deque_impl_data._M_map_size = 0;
          local_108.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
          super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
          super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
          *(__index_type *)
           ((long)&(__return_storage_ptr__->value).
                   super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                   .
                   super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
           + 0x20) = '\x05';
          std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::~vector
                    ((vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_> *)
                     &local_108);
          return __return_storage_ptr__;
        }
      }
      if (from->canonical == (Type *)0x0) {
        Type::resolveCanonical(from);
      }
      if ((from->canonical->super_Symbol).kind == QueueType) {
        if (*(long *)((context->stack).super_SmallVectorBase<slang::ast::EvalContext::Frame>.
                      firstElement + 8) == 0) {
          Type::resolveCanonical((Type *)context);
        }
        if (**(int **)((context->stack).super_SmallVectorBase<slang::ast::EvalContext::Frame>.
                       firstElement + 8) != 0xf) {
          pvVar9 = std::
                   get<5ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                             ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                               *)sourceRange.startLoc);
          SVQueue::deque<slang::ConstantValue*,void>
                    (&local_108,
                     (pvVar9->
                     super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                     )._M_impl.super__Vector_impl_data._M_start,
                     (pvVar9->
                     super__Vector_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>
                     )._M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&local_150);
          if (from->canonical == (Type *)0x0) {
            Type::resolveCanonical(from);
          }
          if ((from->canonical->super_Symbol).kind == QueueType) {
            local_108.maxBound = (uint32_t)from->canonical[1].super_Symbol.name._M_len;
            SVQueue::resizeToBound(&local_108);
            ConstantValue::ConstantValue(__return_storage_ptr__,&local_108);
            std::deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>::~deque
                      (&local_108.
                        super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>);
            return __return_storage_ptr__;
          }
          assert::assertFailed
                    ("T::isKind(kind)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Symbol.h"
                     ,0xc4,"decltype(auto) slang::ast::Symbol::as() [T = slang::ast::QueueType]");
        }
      }
    }
    else {
      bVar2 = Type::isByteArray(from);
      if (bVar2) {
        if (from->canonical == (Type *)0x0) {
          Type::resolveCanonical(from);
        }
        this_00 = from->canonical;
        this_01 = Type::getArrayElementType(this_00);
        bVar2 = Type::isSigned(this_01);
        if (this_00->canonical == (Type *)0x0) {
          Type::resolveCanonical(this_00);
        }
        if ((this_00->canonical->super_Symbol).kind == QueueType) {
          ConstantValue::convertToByteQueue
                    (__return_storage_ptr__,(ConstantValue *)sourceRange.startLoc,bVar2);
          return __return_storage_ptr__;
        }
        bVar3 = Type::hasFixedRange(this_00);
        bVar4 = 0;
        if (bVar3) {
          if ((this_00->super_Symbol).kind != FixedSizeUnpackedArrayType) {
            assert::assertFailed
                      ("T::isKind(kind)",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/Symbol.h"
                       ,0xc4,
                       "decltype(auto) slang::ast::Symbol::as() [T = slang::ast::FixedSizeUnpackedArrayType]"
                      );
          }
          iVar5 = (int)this_00[1].super_Symbol.name._M_len -
                  *(int *)((long)&this_00[1].super_Symbol.name._M_len + 4);
          iVar13 = -iVar5;
          if (0 < iVar5) {
            iVar13 = iVar5;
          }
          bVar4 = iVar13 + 1;
        }
        ConstantValue::convertToByteArray
                  (__return_storage_ptr__,(ConstantValue *)sourceRange.startLoc,bVar4,bVar2);
        return __return_storage_ptr__;
      }
      if (*(long *)((context->stack).super_SmallVectorBase<slang::ast::EvalContext::Frame>.
                    firstElement + 8) == 0) {
        Type::resolveCanonical((Type *)context);
      }
      if (**(int **)((context->stack).super_SmallVectorBase<slang::ast::EvalContext::Frame>.
                     firstElement + 8) != 0x17) {
        plVar11 = (logic_error *)__cxa_allocate_exception(0x10);
        local_128[0] = local_118;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_128,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/AssignmentExpressions.cpp"
                   ,"");
        plVar12 = (long *)std::__cxx11::string::append((char *)local_128);
        local_170._M_dataplus._M_p = (pointer)*plVar12;
        psVar14 = (size_type *)(plVar12 + 2);
        if ((size_type *)local_170._M_dataplus._M_p == psVar14) {
          local_170.field_2._M_allocated_capacity = *psVar14;
          local_170.field_2._8_8_ = plVar12[3];
          local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
        }
        else {
          local_170.field_2._M_allocated_capacity = *psVar14;
        }
        local_170._M_string_length = plVar12[1];
        *plVar12 = (long)psVar14;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        std::__cxx11::to_string(&local_b0,0x33f);
        std::operator+(&local_90,&local_170,&local_b0);
        plVar12 = (long *)std::__cxx11::string::append((char *)&local_90);
        local_150 = (long *)*plVar12;
        plVar15 = plVar12 + 2;
        if (local_150 == plVar15) {
          local_140 = *plVar15;
          lStack_138 = plVar12[3];
          local_150 = &local_140;
        }
        else {
          local_140 = *plVar15;
        }
        local_148 = plVar12[1];
        *plVar12 = (long)plVar15;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        plVar12 = (long *)std::__cxx11::string::append((char *)&local_150);
        local_108.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
        super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
        super__Deque_impl_data._M_map = (_Map_pointer)*plVar12;
        plVar15 = plVar12 + 2;
        if (local_108.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
            super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
            super__Deque_impl_data._M_map == (_Map_pointer)plVar15) {
          local_108.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
          super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
          super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)*plVar15;
          local_108.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
          super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
          super__Deque_impl_data._M_start._M_first = (_Elt_pointer)plVar12[3];
          local_108.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
          super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
          super__Deque_impl_data._M_map =
               &local_108.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
                _M_impl.super__Deque_impl_data._M_start._M_cur;
        }
        else {
          local_108.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
          super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
          super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)*plVar15;
        }
        local_108.super_deque<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>.
        super__Deque_base<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>._M_impl.
        super__Deque_impl_data._M_map_size = plVar12[1];
        *plVar12 = (long)plVar15;
        plVar12[1] = 0;
        *(undefined1 *)(plVar12 + 2) = 0;
        std::logic_error::logic_error(plVar11,(string *)&local_108);
        __cxa_throw(plVar11,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
    }
  }
  std::__detail::__variant::
  _Move_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::_Move_ctor_base((_Move_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                     *)__return_storage_ptr__,
                    (_Move_ctor_base<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                     *)sourceRange.startLoc);
  return __return_storage_ptr__;
}

Assistant:

ConstantValue ConversionExpression::convert(EvalContext& context, const Type& from, const Type& to,
                                            SourceRange sourceRange, ConstantValue&& value,
                                            ConversionKind conversionKind) {
    if (!value)
        return nullptr;

    if (from.isMatching(to))
        return std::move(value);

    if (conversionKind == ConversionKind::BitstreamCast ||
        conversionKind == ConversionKind::StreamingConcat) {
        return Bitstream::evaluateCast(to, std::move(value), sourceRange, context,
                                       conversionKind == ConversionKind::StreamingConcat);
    }

    if (to.isIntegral()) {
        // [11.8.2] last bullet says: the operand shall be sign-extended only if the propagated type
        // is signed. It is different from [11.8.3] ConstantValue::convertToInt uses.
        // ConversionKind::Propagated marked in Expression::PropagationVisitor
        if (conversionKind == ConversionKind::Propagated && value.isInteger())
            value.integer().setSigned(to.isSigned());
        return value.convertToInt(to.getBitWidth(), to.isSigned(), to.isFourState());
    }

    if (to.isFloating()) {
        switch (to.getBitWidth()) {
            case 32:
                return value.convertToShortReal();
            case 64:
                return value.convertToReal();
            default:
                ASSUME_UNREACHABLE;
        }
    }

    if (to.isString())
        return value.convertToStr();

    if (to.isUnpackedArray() && from.isUnpackedArray()) {
        // Conversion to a dynamic array just resizes. Conversion to a fixed array
        // must have the same number of elements in the source.
        ASSERT(!to.hasFixedRange() || !from.hasFixedRange());
        if (to.hasFixedRange()) {
            size_t size = value.size();
            if (size != to.getFixedRange().width()) {
                context.addDiag(diag::ConstEvalDynamicToFixedSize, sourceRange)
                    << from << size << to;
                return nullptr;
            }
        }

        if (!to.isQueue() && from.isQueue()) {
            // Convert from queue to vector.
            auto& q = *value.queue();
            return std::vector(q.begin(), q.end());
        }

        if (to.isQueue() && !from.isQueue()) {
            // Convert from vector to queue.
            auto elems = value.elements();
            SVQueue result(elems.begin(), elems.end());
            result.maxBound = to.getCanonicalType().as<QueueType>().maxBound;
            result.resizeToBound();
            return result;
        }

        return std::move(value);
    }

    if (to.isByteArray()) {
        auto& ct = to.getCanonicalType();
        bool isSigned = ct.getArrayElementType()->isSigned();
        if (ct.isQueue())
            return value.convertToByteQueue(isSigned);

        bitwidth_t size;
        if (ct.hasFixedRange())
            size = ct.as<FixedSizeUnpackedArrayType>().range.width();
        else
            size = 0; // dynamic array use string size

        return value.convertToByteArray(size, isSigned);
    }

    // Null can be assigned to various destination types. It's ok to just
    // keep propagating the null value.
    if (from.isNull())
        return std::move(value);

    ASSUME_UNREACHABLE;
}